

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O1

uint32_t WriteBinaryNodeAnim(aiNodeAnim *nd)

{
  uint uVar1;
  aiVectorKey *paVar2;
  aiQuatKey *in;
  uint32_t uVar3;
  long lVar4;
  size_t sVar5;
  uint32_t n;
  uint32_t t;
  aiAnimBehaviour local_2c;
  
  local_2c = 0x1238;
  fwrite(&local_2c,4,1,(FILE *)out);
  fwrite(&local_2c,4,1,(FILE *)out);
  lVar4 = ftell((FILE *)out);
  uVar1 = (nd->mNodeName).length;
  fwrite(nd,4,1,(FILE *)out);
  fwrite((nd->mNodeName).data,(ulong)uVar1,1,(FILE *)out);
  local_2c = nd->mNumPositionKeys;
  fwrite(&local_2c,4,1,(FILE *)out);
  local_2c = nd->mNumRotationKeys;
  fwrite(&local_2c,4,1,(FILE *)out);
  local_2c = nd->mNumScalingKeys;
  fwrite(&local_2c,4,1,(FILE *)out);
  local_2c = nd->mPreState;
  fwrite(&local_2c,4,1,(FILE *)out);
  local_2c = nd->mPostState;
  fwrite(&local_2c,4,1,(FILE *)out);
  n = uVar1 + 0x18;
  paVar2 = nd->mPositionKeys;
  if (paVar2 != (aiVectorKey *)0x0) {
    if (shortened == true) {
      uVar3 = WriteBounds<aiVectorKey>(paVar2,nd->mNumPositionKeys);
      n = n + uVar3;
    }
    else {
      sVar5 = fwrite(paVar2,1,(ulong)nd->mNumPositionKeys * 0x18,(FILE *)out);
      n = n + (int)sVar5;
    }
  }
  in = nd->mRotationKeys;
  if (in != (aiQuatKey *)0x0) {
    if (shortened == true) {
      uVar3 = WriteBounds<aiQuatKey>(in,nd->mNumRotationKeys);
      n = n + uVar3;
    }
    else {
      sVar5 = fwrite(in,1,(ulong)nd->mNumRotationKeys * 0x18,(FILE *)out);
      n = n + (int)sVar5;
    }
  }
  paVar2 = nd->mScalingKeys;
  if (paVar2 != (aiVectorKey *)0x0) {
    if (shortened == true) {
      uVar3 = WriteBounds<aiVectorKey>(paVar2,nd->mNumScalingKeys);
      n = n + uVar3;
    }
    else {
      sVar5 = fwrite(paVar2,1,(ulong)nd->mNumScalingKeys * 0x18,(FILE *)out);
      n = n + (int)sVar5;
    }
  }
  ChangeInteger((int)lVar4 - 4,n);
  return n;
}

Assistant:

uint32_t WriteBinaryNodeAnim(const aiNodeAnim* nd)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AINODEANIM);

	len += Write<aiString>(nd->mNodeName);
	len += Write<unsigned int>(nd->mNumPositionKeys);
	len += Write<unsigned int>(nd->mNumRotationKeys);
	len += Write<unsigned int>(nd->mNumScalingKeys);
	len += Write<unsigned int>(nd->mPreState);
	len += Write<unsigned int>(nd->mPostState);

	if (nd->mPositionKeys) {
		if (shortened) {
			len += WriteBounds(nd->mPositionKeys,nd->mNumPositionKeys);

		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(nd->mPositionKeys,1,nd->mNumPositionKeys*sizeof(aiVectorKey),out));
	}
	if (nd->mRotationKeys) {
		if (shortened) {
			len += WriteBounds(nd->mRotationKeys,nd->mNumRotationKeys);

		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(nd->mRotationKeys,1,nd->mNumRotationKeys*sizeof(aiQuatKey),out));
	}
	if (nd->mScalingKeys) {
		if (shortened) {
			len += WriteBounds(nd->mScalingKeys,nd->mNumScalingKeys);

		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(nd->mScalingKeys,1,nd->mNumScalingKeys*sizeof(aiVectorKey),out));
	}

	ChangeInteger(old,len);
	return len;
}